

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_stringsegment.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::numparse::impl::StringSegment::toTempUnicodeString
          (UnicodeString *__return_storage_ptr__,StringSegment *this)

{
  char16_t *pcVar1;
  ConstChar16Ptr local_20;
  StringSegment *local_18;
  StringSegment *this_local;
  
  local_18 = this;
  this_local = (StringSegment *)__return_storage_ptr__;
  pcVar1 = UnicodeString::getBuffer(&this->fStr);
  ConstChar16Ptr::ConstChar16Ptr(&local_20,pcVar1 + this->fStart);
  UnicodeString::UnicodeString(__return_storage_ptr__,'\0',&local_20,this->fEnd - this->fStart);
  ConstChar16Ptr::~ConstChar16Ptr(&local_20);
  return __return_storage_ptr__;
}

Assistant:

const UnicodeString StringSegment::toTempUnicodeString() const {
    // Use the readonly-aliasing constructor for efficiency.
    return UnicodeString(FALSE, fStr.getBuffer() + fStart, fEnd - fStart);
}